

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  int depth;
  stbi__uint32 x;
  stbi__uint32 y;
  stbi__context *s;
  stbi__context *psVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  stbi_uc sVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  stbi_uc **ppsVar15;
  char *pcVar16;
  stbi_uc *psVar17;
  byte *pbVar18;
  size_t sVar19;
  int *piVar20;
  uint uVar21;
  ulong uVar22;
  stbi_uc *psVar23;
  byte bVar24;
  long lVar25;
  uint color;
  long lVar26;
  ulong uVar27;
  uint uVar28;
  stbi__uint32 raw_len_00;
  int iVar29;
  long lVar30;
  size_t __size;
  stbi_uc *psVar31;
  long *in_FS_OFFSET;
  int local_51c;
  stbi_uc tc [3];
  ulong local_4d8;
  stbi__uint32 raw_len;
  ulong local_4b0;
  stbi_uc *local_4a8;
  stbi_uc *local_4a0;
  stbi_uc *local_498;
  ulong local_490;
  stbi__context *local_488;
  size_t local_480;
  int local_474;
  int local_470;
  int local_46c;
  ulong local_468;
  long local_460;
  stbi__uint16 tc16 [3];
  stbi_uc palette [1024];
  
  tc[2] = '\0';
  tc[0] = '\0';
  tc[1] = '\0';
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar9 = stbi__check_png_header(s);
  if (iVar9 == 0) {
    local_51c = 0;
  }
  else {
    local_51c = 1;
    if (scan != 1) {
      ppsVar15 = &z->idata;
      bVar4 = true;
      local_468 = 0;
      color = 0;
      bVar5 = false;
      local_4d8 = 0;
      __size = 0;
      local_4b0 = 0;
      bVar6 = false;
      bVar24 = 0;
      do {
        iVar9 = stbi__get16be(s);
        uVar10 = stbi__get16be(s);
        uVar13 = iVar9 * 0x10000 + uVar10;
        uVar11 = stbi__get16be(s);
        uVar12 = stbi__get16be(s);
        uVar12 = uVar12 | uVar11 << 0x10;
        uVar14 = (uint)local_4d8;
        if ((int)uVar12 < 0x49484452) {
          if (uVar12 == 0x43674249) {
            bVar5 = true;
LAB_001620c6:
            stbi__skip(s,uVar13);
LAB_0016241f:
            stbi__get16be(s);
            stbi__get16be(s);
            bVar3 = true;
          }
          else {
            iVar9 = (int)local_4b0;
            if (uVar12 == 0x49444154) {
              if (bVar4) {
LAB_0016215e:
                in_FS_OFFSET[-4] = (long)"Corrupt PNG";
                bVar4 = true;
              }
              else if ((bVar24 == 0) || (uVar14 != 0)) {
                if (scan == 2) {
                  local_51c = 1;
                  if (bVar24 != 0) {
                    s->img_n = (uint)bVar24;
                  }
LAB_0016226d:
                  bVar4 = false;
                  goto LAB_00162d2f;
                }
                if (0x40000000 < uVar13) {
                  pcVar16 = "IDAT section larger than 2^30 bytes";
                  goto LAB_00162142;
                }
                uVar10 = uVar13 + iVar9;
                if (iVar9 <= (int)uVar10) {
                  if ((uint)__size < uVar10) {
                    sVar19 = 0x1000;
                    if (0x1000 < uVar13) {
                      sVar19 = (ulong)uVar13;
                    }
                    if ((uint)__size != 0) {
                      sVar19 = __size;
                    }
                    do {
                      __size = sVar19;
                      sVar19 = (ulong)((uint)__size * 2);
                    } while ((uint)__size < uVar10);
                    psVar17 = (stbi_uc *)realloc(*ppsVar15,__size);
                    if (psVar17 == (stbi_uc *)0x0) {
                      in_FS_OFFSET[-4] = (long)"Out of memory";
                      local_51c = 0;
                      goto LAB_0016226d;
                    }
                    *ppsVar15 = psVar17;
                  }
                  iVar9 = stbi__getn(s,*ppsVar15 + (local_4b0 & 0xffffffff),uVar13);
                  bVar4 = false;
                  if (iVar9 != 0) {
                    local_4b0 = (ulong)uVar10;
                    goto LAB_0016241f;
                  }
                  pcVar16 = "Corrupt PNG";
                  goto LAB_00162142;
                }
LAB_00162153:
                bVar4 = false;
              }
              else {
                in_FS_OFFSET[-4] = (long)"Corrupt PNG";
                bVar4 = false;
                local_4d8 = 0;
              }
              bVar3 = false;
              local_51c = 0;
            }
            else {
              if (uVar12 != 0x49454e44) {
LAB_00162129:
                if (bVar4) goto LAB_0016215e;
                if ((uVar11 >> 0xd & 1) == 0) {
                  pcVar16 = "PNG not supported: unknown PNG chunk type";
LAB_00162142:
                  in_FS_OFFSET[-4] = (long)pcVar16;
                  goto LAB_00162153;
                }
                bVar4 = false;
                goto LAB_001620c6;
              }
              if (bVar4) {
LAB_00162003:
                in_FS_OFFSET[-4] = (long)"Corrupt PNG";
                local_51c = 0;
              }
              else if (scan == 0) {
                if (*ppsVar15 == (stbi_uc *)0x0) goto LAB_00162003;
                raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
                psVar17 = (stbi_uc *)
                          stbi_zlib_decode_malloc_guesssize_headerflag
                                    ((char *)*ppsVar15,iVar9,raw_len,(int *)&raw_len,(uint)!bVar5);
                z->expanded = psVar17;
                local_51c = 0;
                if (psVar17 != (stbi_uc *)0x0) {
                  free(*ppsVar15);
                  raw_len_00 = raw_len;
                  *ppsVar15 = (stbi_uc *)0x0;
                  iVar9 = s->img_n + 1;
                  if (bVar6 || (bVar24 == 0 && req_comp != 3) && iVar9 == req_comp) {
                    s->img_out_n = iVar9;
                  }
                  else {
                    s->img_out_n = s->img_n;
                  }
                  iVar9 = s->img_out_n;
                  depth = z->depth;
                  iVar29 = iVar9 << (depth == 0x10);
                  x = z->s->img_x;
                  y = z->s->img_y;
                  if ((int)local_468 == 0) {
                    iVar9 = stbi__create_png_image_raw(z,z->expanded,raw_len,iVar9,x,y,depth,color);
                    if (iVar9 != 0) goto LAB_001629bc;
                  }
                  else {
                    local_4a8 = z->expanded;
                    local_470 = iVar9;
                    local_4a0 = (stbi_uc *)stbi__malloc_mad3(x,y,iVar29,0);
                    if (local_4a0 != (stbi_uc *)0x0) {
                      local_480 = (size_t)iVar29;
                      lVar25 = 0;
                      psVar17 = local_4a8;
                      local_474 = iVar29;
                      do {
                        psVar1 = z->s;
                        local_498 = (stbi_uc *)(long)(int)(&DAT_0019d380)[lVar25];
                        uVar13 = (&DAT_0019d3c0)[lVar25];
                        uVar28 = ~(&DAT_0019d380)[lVar25] + psVar1->img_x + uVar13;
                        uVar12 = uVar28 / uVar13;
                        uVar10 = (&DAT_0019d3a0)[lVar25];
                        uVar11 = (&DAT_0019d3e0)[lVar25];
                        uVar21 = ~uVar10 + psVar1->img_y + uVar11;
                        uVar14 = uVar21 / uVar11;
                        bVar3 = true;
                        if ((uVar13 <= uVar28) && (uVar11 <= uVar21)) {
                          local_46c = uVar12 * depth * psVar1->img_n;
                          local_4a8 = psVar17;
                          local_488 = (stbi__context *)(long)(int)uVar13;
                          local_460 = lVar25;
                          iVar9 = stbi__create_png_image_raw
                                            (z,psVar17,raw_len_00,local_470,uVar12,uVar14,depth,
                                             color);
                          if (iVar9 == 0) {
                            free(local_4a0);
                            bVar3 = false;
                            psVar17 = local_4a8;
                            lVar25 = local_460;
                          }
                          else {
                            if (0 < (int)uVar14) {
                              iVar29 = uVar10 * local_474;
                              iVar9 = uVar11 * local_474;
                              local_498 = local_4a0 + (long)local_498 * local_480;
                              lVar25 = (long)local_488 * local_480;
                              local_490 = 0;
                              sVar19 = local_480;
                              do {
                                if (0 < (int)uVar12) {
                                  local_488 = z->s;
                                  psVar17 = z->out;
                                  lVar30 = local_490 * (long)(int)uVar12;
                                  lVar26 = 0;
                                  psVar31 = local_498;
                                  do {
                                    memcpy(psVar31 + local_488->img_x * iVar29,
                                           psVar17 + (lVar30 + lVar26) * sVar19,local_480);
                                    lVar26 = lVar26 + 1;
                                    psVar31 = psVar31 + lVar25;
                                    sVar19 = local_480;
                                  } while (lVar26 < (int)uVar12);
                                }
                                local_490 = local_490 + 1;
                                iVar29 = iVar29 + iVar9;
                              } while (local_490 < uVar14);
                            }
                            uVar14 = ((local_46c + 7 >> 3) + 1) * uVar14;
                            free(z->out);
                            raw_len_00 = raw_len_00 - uVar14;
                            bVar3 = true;
                            psVar17 = local_4a8 + uVar14;
                            lVar25 = local_460;
                          }
                        }
                        if (!bVar3) goto LAB_00162d2f;
                        lVar25 = lVar25 + 1;
                      } while (lVar25 != 7);
                      z->out = local_4a0;
LAB_001629bc:
                      if (bVar6) {
                        if (z->depth == 0x10) {
                          stbi__compute_transparency16(z,tc16,s->img_out_n);
                        }
                        else {
                          stbi__compute_transparency(z,tc,s->img_out_n);
                        }
                      }
                      if (bVar5) {
                        piVar20 = (int *)(*in_FS_OFFSET + -8);
                        if (*(int *)((long)in_FS_OFFSET + -4) == 0) {
                          piVar20 = &stbi__de_iphone_flag_global;
                        }
                        if ((*piVar20 != 0) && (2 < s->img_out_n)) {
                          stbi__de_iphone(z);
                        }
                      }
                      if (bVar24 == 0) {
                        if (bVar6) {
                          s->img_n = s->img_n + 1;
                        }
                      }
                      else {
                        s->img_n = (uint)bVar24;
                        uVar13 = (uint)bVar24;
                        if (2 < req_comp) {
                          uVar13 = req_comp;
                        }
                        s->img_out_n = uVar13;
                        psVar17 = z->out;
                        uVar10 = z->s->img_y * z->s->img_x;
                        psVar31 = (stbi_uc *)stbi__malloc_mad2(uVar10,uVar13,0);
                        if (psVar31 == (stbi_uc *)0x0) {
                          in_FS_OFFSET[-4] = (long)"Out of memory";
                        }
                        else {
                          if (uVar13 == 3) {
                            if (uVar10 != 0) {
                              uVar22 = 0;
                              psVar23 = psVar31;
                              do {
                                uVar27 = (ulong)psVar17[uVar22];
                                *psVar23 = palette[uVar27 * 4];
                                psVar23[1] = palette[uVar27 * 4 + 1];
                                psVar23[2] = palette[uVar27 * 4 + 2];
                                psVar23 = psVar23 + 3;
                                uVar22 = uVar22 + 1;
                              } while (uVar10 != uVar22);
                            }
                          }
                          else if (uVar10 != 0) {
                            uVar22 = 0;
                            do {
                              *(undefined4 *)(psVar31 + uVar22 * 4) =
                                   *(undefined4 *)(palette + (ulong)psVar17[uVar22] * 4);
                              uVar22 = uVar22 + 1;
                            } while (uVar10 != uVar22);
                          }
                          free(psVar17);
                          z->out = psVar31;
                        }
                        if (psVar31 == (stbi_uc *)0x0) goto LAB_00162d2f;
                      }
                      free(z->expanded);
                      z->expanded = (stbi_uc *)0x0;
                      stbi__get16be(s);
                      stbi__get16be(s);
                      goto LAB_001621b6;
                    }
                    in_FS_OFFSET[-4] = (long)"Out of memory";
                  }
                }
              }
              else {
LAB_001621b6:
                local_51c = 1;
              }
LAB_00162d2f:
              bVar3 = false;
            }
          }
        }
        else if (uVar12 == 0x74524e53) {
          if (bVar4) {
LAB_0016218c:
            in_FS_OFFSET[-4] = (long)"Corrupt PNG";
            bVar4 = true;
LAB_0016260f:
            local_51c = 0;
          }
          else {
            if (*ppsVar15 != (stbi_uc *)0x0) {
LAB_001625f5:
              in_FS_OFFSET[-4] = (long)"Corrupt PNG";
              bVar4 = false;
              goto LAB_0016260f;
            }
            if (bVar24 == 0) {
              uVar10 = s->img_n;
              if (((uVar10 & 1) == 0) || (uVar10 * 2 != uVar13)) {
                in_FS_OFFSET[-4] = (long)"Corrupt PNG";
                bVar4 = false;
                bVar24 = 0;
                goto LAB_0016260f;
              }
              if (scan != 2) {
                bVar6 = true;
                if (z->depth == 0x10) {
                  if (0 < s->img_n) {
                    lVar25 = 0;
                    do {
                      iVar9 = stbi__get16be(s);
                      tc16[lVar25] = (stbi__uint16)iVar9;
                      lVar25 = lVar25 + 1;
                    } while (lVar25 < s->img_n);
                    bVar4 = false;
                    bVar24 = 0;
                    goto LAB_0016241f;
                  }
                }
                else if (0 < s->img_n) {
                  lVar25 = 0;
                  do {
                    iVar9 = stbi__get16be(s);
                    tc[lVar25] = ""[z->depth] * (char)iVar9;
                    lVar25 = lVar25 + 1;
                  } while (lVar25 < s->img_n);
                }
                bVar24 = 0;
LAB_00162234:
                bVar4 = false;
                goto LAB_0016241f;
              }
              s->img_n = uVar10 + 1;
              local_51c = 1;
              bVar6 = true;
              bVar4 = false;
              bVar24 = 0;
            }
            else {
              if (scan != 2) {
                if (uVar14 != 0) {
                  if (uVar13 <= uVar14) {
                    bVar24 = 4;
                    if (uVar13 != 0) {
                      uVar22 = 0;
                      do {
                        psVar17 = s->img_buffer;
                        if (psVar17 < s->img_buffer_end) {
LAB_00162b15:
                          s->img_buffer = psVar17 + 1;
                          sVar7 = *psVar17;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            stbi__refill_buffer(s);
                            psVar17 = s->img_buffer;
                            goto LAB_00162b15;
                          }
                          sVar7 = '\0';
                        }
                        palette[uVar22 * 4 + 3] = sVar7;
                        uVar22 = uVar22 + 1;
                        bVar24 = 4;
                      } while (uVar10 + iVar9 * 0x10000 != uVar22);
                    }
                    goto LAB_00162234;
                  }
                  goto LAB_001625f5;
                }
                in_FS_OFFSET[-4] = (long)"Corrupt PNG";
                bVar4 = false;
                local_4d8 = 0;
                goto LAB_0016260f;
              }
              s->img_n = 4;
              local_51c = 1;
              bVar4 = false;
            }
          }
          bVar3 = false;
        }
        else {
          if (uVar12 == 0x504c5445) {
            if (bVar4) goto LAB_0016218c;
            if ((0x300 < uVar13) ||
               (local_4d8 = (ulong)uVar10 * 0x55555556 >> 0x20,
               (int)((ulong)uVar10 * 0x55555556 >> 0x20) * 3 != uVar13)) goto LAB_001625f5;
            bVar4 = false;
            if (uVar10 < 3) goto LAB_00162234;
            uVar22 = 0;
            do {
              psVar17 = s->img_buffer;
              if (psVar17 < s->img_buffer_end) {
LAB_00162528:
                s->img_buffer = psVar17 + 1;
                sVar7 = *psVar17;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  psVar17 = s->img_buffer;
                  goto LAB_00162528;
                }
                sVar7 = '\0';
              }
              palette[uVar22 * 4] = sVar7;
              psVar17 = s->img_buffer;
              if (psVar17 < s->img_buffer_end) {
LAB_00162567:
                s->img_buffer = psVar17 + 1;
                sVar7 = *psVar17;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  psVar17 = s->img_buffer;
                  goto LAB_00162567;
                }
                sVar7 = '\0';
              }
              palette[uVar22 * 4 + 1] = sVar7;
              psVar17 = s->img_buffer;
              if (psVar17 < s->img_buffer_end) {
LAB_001625a2:
                s->img_buffer = psVar17 + 1;
                sVar7 = *psVar17;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  psVar17 = s->img_buffer;
                  goto LAB_001625a2;
                }
                sVar7 = '\0';
              }
              palette[uVar22 * 4 + 2] = sVar7;
              palette[uVar22 * 4 + 3] = 0xff;
              uVar22 = uVar22 + 1;
            } while (local_4d8 != uVar22);
            goto LAB_0016241f;
          }
          if (uVar12 != 0x49484452) goto LAB_00162129;
          if ((!bVar4) || (uVar13 != 0xd)) goto LAB_001623f0;
          iVar9 = stbi__get16be(s);
          uVar13 = stbi__get16be(s);
          s->img_x = uVar13 | iVar9 << 0x10;
          iVar9 = stbi__get16be(s);
          uVar13 = stbi__get16be(s);
          uVar13 = uVar13 | iVar9 << 0x10;
          s->img_y = uVar13;
          if ((uVar13 < 0x1000001) && (s->img_x < 0x1000001)) {
            pbVar18 = s->img_buffer;
            if (pbVar18 < s->img_buffer_end) {
LAB_0016237e:
              s->img_buffer = pbVar18 + 1;
              bVar8 = *pbVar18;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                pbVar18 = s->img_buffer;
                goto LAB_0016237e;
              }
              bVar8 = 0;
            }
            z->depth = (uint)bVar8;
            if ((0x10 < bVar8) || ((0x10116U >> (bVar8 & 0x1f) & 1) == 0)) {
              pcVar16 = "PNG not supported: 1/2/4/8/16-bit only";
              goto LAB_001623f7;
            }
            pbVar18 = s->img_buffer;
            if (pbVar18 < s->img_buffer_end) {
LAB_001623d1:
              s->img_buffer = pbVar18 + 1;
              color = (uint)*pbVar18;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                pbVar18 = s->img_buffer;
                goto LAB_001623d1;
              }
              color = 0;
            }
            if (6 < (byte)color) {
LAB_001623f0:
              pcVar16 = "Corrupt PNG";
              goto LAB_001623f7;
            }
            if (color == 3) {
              bVar8 = 3;
              if (z->depth != 0x10) goto LAB_00162a22;
              in_FS_OFFSET[-4] = (long)"Corrupt PNG";
              color = 3;
              goto LAB_00162402;
            }
            bVar8 = bVar24;
            if ((color & 1) != 0) goto LAB_001623f0;
LAB_00162a22:
            bVar24 = bVar8;
            psVar17 = s->img_buffer;
            if (psVar17 < s->img_buffer_end) {
LAB_00162a48:
              s->img_buffer = psVar17 + 1;
              if (*psVar17 == '\0') goto LAB_00162a58;
LAB_00162ab0:
              in_FS_OFFSET[-4] = (long)"Corrupt PNG";
              goto LAB_00162402;
            }
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              psVar17 = s->img_buffer;
              goto LAB_00162a48;
            }
LAB_00162a58:
            sVar7 = stbi__get8(s);
            if (sVar7 != '\0') goto LAB_00162ab0;
            bVar8 = stbi__get8(s);
            local_468 = (ulong)bVar8;
            if (((1 < bVar8) || (uVar13 = s->img_x, uVar13 == 0)) ||
               (uVar10 = s->img_y, uVar10 == 0)) goto LAB_00162ab0;
            if (bVar24 == 0) {
              uVar11 = (uint)(3 < (byte)color) + (color & 2) + 1;
              s->img_n = uVar11;
              if ((uint)((0x40000000 / (ulong)uVar13) / (ulong)uVar11) < uVar10) {
                in_FS_OFFSET[-4] = (long)"Image too large to decode";
                bVar24 = 0;
                goto LAB_00162402;
              }
            }
            else {
              s->img_n = 1;
              if ((uint)(0x40000000 / (ulong)uVar13 >> 2) < uVar10) goto LAB_00162ab0;
            }
            bVar2 = true;
          }
          else {
            pcVar16 = "Very large image (corrupt?)";
LAB_001623f7:
            in_FS_OFFSET[-4] = (long)pcVar16;
LAB_00162402:
            bVar2 = false;
            local_51c = 0;
          }
          bVar4 = false;
          bVar3 = false;
          if (bVar2) goto LAB_0016241f;
        }
      } while (bVar3);
    }
  }
  return local_51c;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s);
            s->img_y = stbi__get32be(s);
            if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
            }
            // even with SCAN_header, have to scan to see if we have a tRNS
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               // non-paletted with tRNS = constant alpha. if header-scanning, we can stop now.
               if (scan == STBI__SCAN_header) { ++s->img_n; return 1; }
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) {
               // header scan definitely stops at first IDAT
               if (pal_img_n)
                  s->img_n = pal_img_n;
               return 1;
            }
            if (c.length > (1u << 30)) return stbi__err("IDAT size limit", "IDAT section larger than 2^30 bytes");
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            // end of PNG chunk, read and skip CRC
            stbi__get32be(s);
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}